

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::AdvancedFP64Case1::Run(AdvancedFP64Case1 *this)

{
  CallLogWrapper *this_00;
  long lVar1;
  bool bVar2;
  GLuint program;
  GLint location;
  bool *compile_error;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  GLdouble data;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "\nlayout(local_size_x = 4) in;\nlayout(std140, binding = 0) buffer ShaderStorageBlock {\n  double data;\n} g_shader_storage[4];\nlayout(std140, binding = 0) uniform UniformBlock {\n  double data;\n} g_uniform[2];\nuniform dvec2 g_uniform_def;\n\nvoid main() {\n  if (gl_GlobalInvocationID.x == 0) {\n    g_shader_storage[0].data = floor(g_uniform[0].data + 0.1LF);\n  } else if (gl_GlobalInvocationID.x == 1) {\n    g_shader_storage[1].data = ceil(g_uniform[1].data + 0.2LF);\n  } else if (gl_GlobalInvocationID.x == 2) {\n    g_shader_storage[2].data = min(g_uniform_def[0] + 0.1LF, 1.0LF);\n  } else if (gl_GlobalInvocationID.x == 3) {\n    g_shader_storage[3].data = max(g_uniform_def[0], g_uniform_def.y);\n  }\n}"
             ,"");
  program = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_50);
  this->m_program = program;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    program = this->m_program;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  bVar2 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  lVar4 = -1;
  if (bVar2) {
    glu::CallLogWrapper::glGenBuffers(this_00,4,this->m_storage_buffer);
    lVar4 = 0;
    do {
      lVar1 = lVar4 + 1;
      local_50._M_dataplus._M_p = (pointer)(double)(int)lVar1;
      glu::CallLogWrapper::glBindBufferBase
                (this_00,0x90d2,(GLuint)lVar4,this->m_storage_buffer[lVar4]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,8,&local_50,0x88e4);
      lVar4 = lVar1;
    } while (lVar1 != 4);
    glu::CallLogWrapper::glGenBuffers(this_00,2,this->m_uniform_buffer);
    lVar4 = 0;
    bVar2 = true;
    do {
      bVar3 = bVar2;
      local_50._M_dataplus._M_p = (pointer)(double)((GLuint)lVar4 + 1);
      glu::CallLogWrapper::glBindBufferBase
                (this_00,0x8a11,(GLuint)lVar4,this->m_uniform_buffer[lVar4]);
      glu::CallLogWrapper::glBufferData(this_00,0x8a11,8,&local_50,0x88e4);
      lVar4 = 1;
      uVar6 = 0;
      bVar2 = false;
    } while (bVar3);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    location = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_uniform_def");
    glu::CallLogWrapper::glUniform2d(this_00,location,1.0,2.0);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[0]);
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,8,&local_50);
    if (((double)local_50._M_dataplus._M_p != 1.0) || (NAN((double)local_50._M_dataplus._M_p))) {
      lVar4 = -1;
    }
    else {
      uVar6 = 0;
      do {
        uVar5 = uVar6;
        if (uVar5 == 3) {
          return 0;
        }
        glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[uVar5 + 1]);
        glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,8,&local_50);
        uVar6 = uVar5 + 1;
      } while (((double)local_50._M_dataplus._M_p == (double)(&DAT_01a43df8)[uVar5]) &&
              (!NAN((double)local_50._M_dataplus._M_p) && !NAN((double)(&DAT_01a43df8)[uVar5])));
      lVar4 = -(ulong)(uVar5 < 3);
    }
    anon_unknown_0::Output("Data at index %d is %f should be %f.\n",uVar6 & 0xffffffff);
  }
  return lVar4;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 4) in;" NL "layout(std140, binding = 0) buffer ShaderStorageBlock {" NL
			   "  double data;" NL "} g_shader_storage[4];" NL "layout(std140, binding = 0) uniform UniformBlock {" NL
			   "  double data;" NL "} g_uniform[2];" NL "uniform dvec2 g_uniform_def;" NL NL "void main() {" NL
			   "  if (gl_GlobalInvocationID.x == 0) {" NL
			   "    g_shader_storage[0].data = floor(g_uniform[0].data + 0.1LF);" // floor(1.1LF) == 1.0LF
			NL "  } else if (gl_GlobalInvocationID.x == 1) {" NL
			   "    g_shader_storage[1].data = ceil(g_uniform[1].data + 0.2LF);" // ceil(2.2LF) == 3.0LF
			NL "  } else if (gl_GlobalInvocationID.x == 2) {" NL
			   "    g_shader_storage[2].data = min(g_uniform_def[0] + 0.1LF, 1.0LF);" // min(1.1LF, 1.0LF) == 1.0LF
			NL "  } else if (gl_GlobalInvocationID.x == 3) {" NL
			   "    g_shader_storage[3].data = max(g_uniform_def[0], g_uniform_def.y);" // max(1.0LF, 2.0LF) == 2.0LF
			NL "  }" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(4, m_storage_buffer);
		for (GLuint i = 0; i < 4; ++i)
		{
			const GLdouble data = static_cast<GLdouble>(i + 1);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), &data, GL_STATIC_DRAW);
		}

		glGenBuffers(2, m_uniform_buffer);
		for (GLuint i = 0; i < 2; ++i)
		{
			const GLdouble data = static_cast<GLdouble>(i + 1);
			glBindBufferBase(GL_UNIFORM_BUFFER, i, m_uniform_buffer[i]);
			glBufferData(GL_UNIFORM_BUFFER, sizeof(data), &data, GL_STATIC_DRAW);
		}

		glUseProgram(m_program);
		glUniform2d(glGetUniformLocation(m_program, "g_uniform_def"), 1.0, 2.0);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* validate */
		{
			const GLdouble expected[4] = { 1.0, 3.0, 1.0, 2.0 };
			for (int i = 0; i < 4; ++i)
			{
				GLdouble data;
				glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[i]);
				glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), &data);
				if (data != expected[i])
				{
					Output("Data at index %d is %f should be %f.\n", i, data, expected[i]);
					return ERROR;
				}
			}
		}
		return NO_ERROR;
	}